

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::val
          (FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_> *this)

{
  Fad<double> *in_RSI;
  value_type *in_RDI;
  Fad<double> *in_stack_ffffffffffffffe0;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffffe8;
  Fad<double> *this_00;
  
  this_00 = in_RSI;
  FadCst<double>::val((FadCst<double> *)in_RSI);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)(in_RSI->dx_).ptr_to_data);
  operator-<double,_Fad<double>,_nullptr>
            ((double)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Fad<double>::Fad<FadBinaryMinus<FadCst<double>,Fad<double>>>(this_00,in_stack_ffffffffffffffe8);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_RSI);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}